

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O0

void CB::print_update(vw *all,bool is_test,example *ec,multi_ex *ec_seq,bool action_scores)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  undefined8 uVar4;
  size_t sVar5;
  action_score *paVar6;
  vector<example_*,_std::allocator<example_*>_> *in_RCX;
  long in_RDX;
  byte in_SIL;
  long *in_RDI;
  byte in_R8B;
  double dVar7;
  ostringstream pred_buf;
  string label_buf;
  size_t i;
  size_t pred;
  size_t num_features;
  example *in_stack_fffffffffffffd98;
  string local_210 [35];
  char local_1ed;
  int local_1ec;
  ostringstream local_1e8 [24];
  float in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  size_t in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe5f;
  shared_data *in_stack_fffffffffffffe60;
  float in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  size_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff9f;
  shared_data *in_stack_ffffffffffffffa0;
  ulong local_40;
  
  dVar7 = shared_data::weighted_examples((shared_data *)*in_RDI);
  if ((((double)*(float *)(*in_RDI + 0x50) <= dVar7) &&
      ((*(byte *)((long)in_RDI + 0x3439) & 1) == 0)) && ((*(byte *)((long)in_RDI + 0x9c) & 1) == 0))
  {
    if (in_RCX != (vector<example_*,_std::allocator<example_*>_> *)0x0) {
      for (local_40 = 0; sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RCX),
          local_40 < sVar2; local_40 = local_40 + 1) {
        std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RCX,local_40);
        bVar1 = ec_is_example_header(in_stack_fffffffffffffd98);
        if (!bVar1) {
          std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RCX,local_40);
        }
      }
    }
    std::__cxx11::string::string((string *)&stack0xffffffffffffffa0);
    if ((in_SIL & 1) == 0) {
      std::__cxx11::string::operator=((string *)&stack0xffffffffffffffa0," known");
    }
    else {
      std::__cxx11::string::operator=((string *)&stack0xffffffffffffffa0," unknown");
    }
    if ((in_R8B & 1) == 0) {
      shared_data::print_update
                (in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f,in_stack_ffffffffffffff90
                 ,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                 (bool)in_stack_ffffffffffffff77,in_stack_ffffffffffffff70);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1e8);
      local_1ec = (int)std::setw(8);
      poVar3 = std::operator<<((ostream *)local_1e8,(_Setw)local_1ec);
      uVar4 = std::ostream::operator<<(poVar3,std::right);
      local_1ed = (char)std::setfill<char>(' ');
      std::operator<<(uVar4,local_1ed);
      sVar5 = v_array<ACTION_SCORE::action_score>::size
                        ((v_array<ACTION_SCORE::action_score> *)(in_RDX + 0x6850));
      if (sVar5 == 0) {
        std::operator<<((ostream *)local_1e8,"no action");
      }
      else {
        paVar6 = v_array<ACTION_SCORE::action_score>::operator[]
                           ((v_array<ACTION_SCORE::action_score> *)(in_RDX + 0x6850),0);
        poVar3 = (ostream *)std::ostream::operator<<(local_1e8,paVar6->action);
        poVar3 = std::operator<<(poVar3,":");
        paVar6 = v_array<ACTION_SCORE::action_score>::operator[]
                           ((v_array<ACTION_SCORE::action_score> *)(in_RDX + 0x6850),0);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,paVar6->score);
        std::operator<<(poVar3,"...");
      }
      std::__cxx11::ostringstream::str();
      shared_data::print_update
                (in_stack_fffffffffffffe60,(bool)in_stack_fffffffffffffe5f,in_stack_fffffffffffffe50
                 ,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (bool)in_stack_fffffffffffffe37,in_stack_fffffffffffffe30);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::ostringstream::~ostringstream(local_1e8);
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  }
  return;
}

Assistant:

void print_update(vw& all, bool is_test, example& ec, multi_ex* ec_seq, bool action_scores)
{
  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet && !all.bfgs)
  {
    size_t num_features = ec.num_features;

    size_t pred = ec.pred.multiclass;
    if (ec_seq != nullptr)
    {
      num_features = 0;
      // TODO: code duplication csoaa.cc LabelDict::ec_is_example_header
      for (size_t i = 0; i < (*ec_seq).size(); i++)
        if (!CB::ec_is_example_header(*(*ec_seq)[i]))
          num_features += (*ec_seq)[i]->num_features;
    }
    std::string label_buf;
    if (is_test)
      label_buf = " unknown";
    else
      label_buf = " known";

    if (action_scores)
    {
      std::ostringstream pred_buf;
      pred_buf << std::setw(all.sd->col_current_predict) << std::right << std::setfill(' ');
      if (ec.pred.a_s.size() > 0)
        pred_buf << ec.pred.a_s[0].action << ":" << ec.pred.a_s[0].score << "...";
      else
        pred_buf << "no action";
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, pred_buf.str(), num_features,
          all.progress_add, all.progress_arg);
    }
    else
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, (uint32_t)pred, num_features,
          all.progress_add, all.progress_arg);
  }
}